

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O3

pt_query_decoder * pt_qry_alloc_decoder(pt_config *config)

{
  int iVar1;
  pt_query_decoder *decoder;
  
  decoder = (pt_query_decoder *)malloc(2000);
  if (decoder != (pt_query_decoder *)0x0) {
    iVar1 = pt_qry_decoder_init(decoder,config);
    if (-1 < iVar1) {
      return decoder;
    }
    free(decoder);
  }
  return (pt_query_decoder *)0x0;
}

Assistant:

struct pt_query_decoder *pt_qry_alloc_decoder(const struct pt_config *config)
{
	struct pt_query_decoder *decoder;
	int errcode;

	decoder = malloc(sizeof(*decoder));
	if (!decoder)
		return NULL;

	errcode = pt_qry_decoder_init(decoder, config);
	if (errcode < 0) {
		free(decoder);
		return NULL;
	}

	return decoder;
}